

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::detail::DoubleAPFloat::roundToIntegral(DoubleAPFloat *this,roundingMode RM)

{
  opStatus oVar1;
  undefined1 local_70 [36];
  opStatus local_4c;
  undefined1 local_48 [4];
  opStatus Ret;
  undefined1 local_38 [8];
  APFloat Tmp;
  roundingMode RM_local;
  DoubleAPFloat *this_local;
  
  Tmp.U._20_4_ = RM;
  if (this->Semantics != (fltSemantics *)semPPCDoubleDouble) {
    __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x1052,
                  "APFloat::opStatus llvm::detail::DoubleAPFloat::roundToIntegral(APFloat::roundingMode)"
                 );
  }
  bitcastToAPInt((DoubleAPFloat *)local_48);
  APFloat::APFloat((APFloat *)local_38,(fltSemantics *)semPPCDoubleDoubleLegacy,(APInt *)local_48);
  APInt::~APInt((APInt *)local_48);
  local_4c = APFloat::roundToIntegral((APFloat *)local_38,Tmp.U._20_4_);
  APFloat::bitcastToAPInt((APFloat *)local_70);
  DoubleAPFloat((DoubleAPFloat *)(local_70 + 0x10),(fltSemantics *)semPPCDoubleDouble,
                (APInt *)local_70);
  operator=(this,(DoubleAPFloat *)(local_70 + 0x10));
  ~DoubleAPFloat((DoubleAPFloat *)(local_70 + 0x10));
  APInt::~APInt((APInt *)local_70);
  oVar1 = local_4c;
  APFloat::~APFloat((APFloat *)local_38);
  return oVar1;
}

Assistant:

APFloat::opStatus DoubleAPFloat::roundToIntegral(APFloat::roundingMode RM) {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  APFloat Tmp(semPPCDoubleDoubleLegacy, bitcastToAPInt());
  auto Ret = Tmp.roundToIntegral(RM);
  *this = DoubleAPFloat(semPPCDoubleDouble, Tmp.bitcastToAPInt());
  return Ret;
}